

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O1

char * __thiscall glcts::TessellationShaderBarrier2::getVSCode(TessellationShaderBarrier2 *this)

{
  return "${VERSION}\n\nvoid main()\n{\n}\n";
}

Assistant:

const char* TessellationShaderBarrier2::getVSCode()
{
	static const char* vs_code = "${VERSION}\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "}\n";

	return vs_code;
}